

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

BitWidth __thiscall
flexbuffers::Builder::Value::ElemWidth(Value *this,size_t buf_size,size_t elem_index)

{
  Type TVar1;
  BitWidth BVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  TVar1 = this->type_;
  if (TVar1 == FBT_BOOL || (int)TVar1 < 4) {
    return this->min_bit_width_;
  }
  bVar5 = false;
  uVar3 = 1;
  do {
    uVar4 = ((uVar3 - 1 & -buf_size) + buf_size + uVar3 * elem_index) - (this->field_0).i_;
    BVar2 = BIT_WIDTH_8;
    if ((0xff < uVar4) && (BVar2 = BIT_WIDTH_16, 0xffff < uVar4)) {
      BVar2 = BIT_WIDTH_64 - (uVar4 >> 0x20 == 0);
    }
    if (1L << ((byte)BVar2 & 0x3f) == uVar3) break;
    bVar5 = 4 < uVar3;
    uVar3 = uVar3 * 2;
    BVar2 = CONCAT31((int3)(TVar1 >> 8),TVar1 == FBT_BOOL || (int)TVar1 < 4);
  } while (!bVar5);
  if (!bVar5) {
    return BVar2;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x60d,"BitWidth flexbuffers::Builder::Value::ElemWidth(size_t, size_t) const");
}

Assistant:

BitWidth ElemWidth(size_t buf_size, size_t elem_index) const {
      if (IsInline(type_)) {
        return min_bit_width_;
      } else {
        // We have an absolute offset, but want to store a relative offset
        // elem_index elements beyond the current buffer end. Since whether
        // the relative offset fits in a certain byte_width depends on
        // the size of the elements before it (and their alignment), we have
        // to test for each size in turn.
        for (size_t byte_width = 1;
             byte_width <= sizeof(flatbuffers::largest_scalar_t);
             byte_width *= 2) {
          // Where are we going to write this offset?
          auto offset_loc = buf_size +
                            flatbuffers::PaddingBytes(buf_size, byte_width) +
                            elem_index * byte_width;
          // Compute relative offset.
          auto offset = offset_loc - u_;
          // Does it fit?
          auto bit_width = WidthU(offset);
          if (static_cast<size_t>(static_cast<size_t>(1U) << bit_width) ==
              byte_width)
            return bit_width;
        }
        FLATBUFFERS_ASSERT(false);  // Must match one of the sizes above.
        return BIT_WIDTH_64;
      }
    }